

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_decoding_backend_init_file_w__mp3
                    (void *pUserData,wchar_t *pFilePath,ma_decoding_backend_config *pConfig,
                    ma_allocation_callbacks *pAllocationCallbacks,ma_data_source **ppBackend)

{
  ma_decoding_backend_config pMP3_00;
  wchar_t *in_RCX;
  ma_decoding_backend_config *in_R8;
  ma_mp3 *pMP3;
  ma_result result;
  ma_allocation_callbacks *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 local_4;
  
  pMP3_00 = (ma_decoding_backend_config)
            ma_malloc((size_t)in_stack_ffffffffffffffb8,(ma_allocation_callbacks *)0x269a4c);
  if (pMP3_00 == (ma_decoding_backend_config)0x0) {
    local_4 = MA_OUT_OF_MEMORY;
  }
  else {
    local_4 = ma_mp3_init_file_w(in_RCX,in_R8,
                                 (ma_allocation_callbacks *)
                                 CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                                 (ma_mp3 *)pMP3_00);
    if (local_4 == MA_SUCCESS) {
      *in_R8 = pMP3_00;
      local_4 = MA_SUCCESS;
    }
    else {
      ma_free((void *)pMP3_00,in_stack_ffffffffffffffb8);
    }
  }
  return local_4;
}

Assistant:

static ma_result ma_decoding_backend_init_file_w__mp3(void* pUserData, const wchar_t* pFilePath, const ma_decoding_backend_config* pConfig, const ma_allocation_callbacks* pAllocationCallbacks, ma_data_source** ppBackend)
{
    ma_result result;
    ma_mp3* pMP3;

    (void)pUserData;    /* For now not using pUserData, but once we start storing the vorbis decoder state within the ma_decoder structure this will be set to the decoder so we can avoid a malloc. */

    /* For now we're just allocating the decoder backend on the heap. */
    pMP3 = (ma_mp3*)ma_malloc(sizeof(*pMP3), pAllocationCallbacks);
    if (pMP3 == NULL) {
        return MA_OUT_OF_MEMORY;
    }

    result = ma_mp3_init_file_w(pFilePath, pConfig, pAllocationCallbacks, pMP3);
    if (result != MA_SUCCESS) {
        ma_free(pMP3, pAllocationCallbacks);
        return result;
    }

    *ppBackend = pMP3;

    return MA_SUCCESS;
}